

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::drawInfo
          (DebugInfoRenderer *this,deUint64 secondsElapsed,int texMem,int maxTexMem,int bufMem,
          int maxBufMem,int iterNdx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  ostream *poVar5;
  _func_int *p_Var6;
  ostringstream text;
  string local_1d8;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  long local_1a8;
  string local_1a0 [8];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1b8 = maxBufMem;
  local_1b4 = bufMem;
  local_1b0 = maxTexMem;
  local_1ac = texMem;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8 + -0x18)) = 2;
  lVar2 = *(long *)(local_1a8 + -0x18);
  if (acStack_c8[lVar2 + 1] == '\0') {
    std::ios::widen((char)&local_1d8 + (char)lVar2 + '0');
    acStack_c8[lVar2 + 1] = '\x01';
  }
  acStack_c8[lVar2] = '0';
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  pp_Var3 = poVar5->_vptr_basic_ostream;
  *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var3[-3]) = 2;
  p_Var4 = pp_Var3[-3];
  p_Var6 = (_func_int *)((long)&poVar5->_vptr_basic_ostream + (long)p_Var4);
  if ((&poVar5->field_0xe1)[(long)p_Var4] == '\0') {
    std::ios::widen((char)p_Var6);
    p_Var6[0xe1] = (code)0x1;
  }
  p_Var6[0xe0] = (code)0x30;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  pp_Var3 = poVar5->_vptr_basic_ostream;
  *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var3[-3]) = 2;
  p_Var4 = pp_Var3[-3];
  p_Var6 = (_func_int *)((long)&poVar5->_vptr_basic_ostream + (long)p_Var4);
  if ((&poVar5->field_0xe1)[(long)p_Var4] == '\0') {
    std::ios::widen((char)p_Var6);
    p_Var6[0xe1] = (code)0x1;
  }
  p_Var6[0xe0] = (code)0x30;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  pp_Var3 = poVar5->_vptr_basic_ostream;
  *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var3[-3]) = 2;
  p_Var4 = pp_Var3[-3];
  p_Var6 = (_func_int *)((long)&poVar5->_vptr_basic_ostream + (long)p_Var4);
  if ((&poVar5->field_0xe1)[(long)p_Var4] == '\0') {
    std::ios::widen((char)p_Var6);
    p_Var6[0xe1] = (code)0x1;
  }
  p_Var6[0xe0] = (code)0x30;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,0);
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,0x1af8059);
  std::__cxx11::stringbuf::str(local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  poVar5 = std::ostream::_M_insert<double>((double)((float)local_1ac * 9.536743e-07));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
  std::ostream::_M_insert<double>((double)((float)local_1b0 * 9.536743e-07));
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,0x1af8059);
  std::__cxx11::stringbuf::str(local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  poVar5 = std::ostream::_M_insert<double>((double)((float)local_1b4 * 9.536743e-07));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
  std::ostream::_M_insert<double>((double)((float)local_1b8 * 9.536743e-07));
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,0x1af8059);
  std::__cxx11::stringbuf::str(local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8 + -0x18)) = 0;
  std::ostream::operator<<(&local_1a8,iterNdx);
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  render(this);
  return;
}

Assistant:

void DebugInfoRenderer::drawInfo (const deUint64 secondsElapsed, const int texMem, const int maxTexMem, const int bufMem, const int maxBufMem, const int iterNdx)
{
	const deUint64 m = secondsElapsed / 60;
	const deUint64 h = m / 60;
	const deUint64 d = h / 24;

	{
		std::ostringstream text;

		text << std::setw(2) << std::setfill('0') << d << ":"
			 << std::setw(2) << std::setfill('0') << h % 24 << ":"
			 << std::setw(2) << std::setfill('0') << m % 60 << ":"
			 << std::setw(2) << std::setfill('0') << secondsElapsed % 60;
		addTextToBuffer(text.str(), 0);
		text.str("");

		text << std::fixed << std::setprecision(2) << (float)texMem/Mi << "/" << (float)maxTexMem/Mi;
		addTextToBuffer(text.str(), 1);
		text.str("");

		text << std::fixed << std::setprecision(2) << (float)bufMem/Mi << "/" << (float)maxBufMem/Mi;
		addTextToBuffer(text.str(), 2);
		text.str("");

		text << std::setw(0) << iterNdx;
		addTextToBuffer(text.str(), 3);
	}

	render();
}